

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

int __thiscall CPU::instrLDA0xa9(CPU *this)

{
  uint8_t argument;
  
  argument = immediate_addr(this);
  LDA(this,argument);
  return 2;
}

Assistant:

int CPU::instrLDA0xa9() {
	LDA(immediate_addr());
	return 2;
}